

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void dfg_shutdown_handler
               (CManager cm,CMConnection conn,void *vmsg,void *client_data,attr_list attrs)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  long lVar4;
  pthread_t pVar5;
  long lVar6;
  timespec ts;
  timespec local_40;
  
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                   ,0x45a);
  *(undefined4 *)((long)client_data + 0x18) = *vmsg;
  *(undefined4 *)((long)client_data + 0x40) = 1;
  iVar2 = CMtrace_val[0xd];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,EVdfgVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar5 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Client %d has confirmed shutdown\n",
            (ulong)*(uint *)((long)client_data + 0x30));
  }
  fflush((FILE *)cm->CMTrace_file);
  lVar4 = *(long *)((long)client_data + 8);
  if (lVar4 != 0) {
    lVar6 = 0;
    do {
      if (*(int *)(lVar4 + lVar6) == -1) break;
      iVar2 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)cm->CMTrace_file;
          _Var3 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"Client %d shutdown signalling %d\n",
                (ulong)*(uint *)((long)client_data + 0x30),
                (ulong)*(uint *)(*(long *)((long)client_data + 8) + lVar6));
      }
      fflush((FILE *)cm->CMTrace_file);
      INT_CMCondition_signal(*client_data,*(int *)(*(long *)((long)client_data + 8) + lVar6));
      lVar4 = *(long *)((long)client_data + 8);
      lVar6 = lVar6 + 4;
    } while (lVar4 != 0);
  }
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x465);
  return;
}

Assistant:

static void
dfg_shutdown_handler(CManager cm, CMConnection conn, void *vmsg, 
		  void *client_data, attr_list attrs)
{
    EVclient client = client_data;
    EVshutdown_ptr msg =  vmsg;
    (void)cm;
    (void)conn;
    (void)attrs;
    int i = 0;
    CManager_lock(cm);
    /* I'm the client, all is done */
    client->shutdown_value = msg->value;
    client->already_shutdown = 1;
    CMtrace_out(cm, EVdfgVerbose, "Client %d has confirmed shutdown\n", client->my_node_id);
    while (client->shutdown_conditions && (client->shutdown_conditions[i] != -1)){
	CMtrace_out(cm, EVdfgVerbose, "Client %d shutdown signalling %d\n", client->my_node_id, client->shutdown_conditions[i]);
	INT_CMCondition_signal(client->cm, client->shutdown_conditions[i++]);
    }
//GSE  - does client have state?
//    CMtrace_out(cm, EVdfgVerbose, "EVDFG exit shutdown master DFG state is %s\n", str_state[client->state]);
    CManager_unlock(cm);
}